

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<pbrt::Point2<float>,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),pbrt::Point2<float>(*)(double_const*,pbrt::FileLoc_const*)>
          (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
           *__return_storage_ptr__,ParameterDictionary *this,string *name,ParameterType type,
          char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_Point2<float>_double_ptr_FileLoc_ptr *convert)

{
  string *args;
  Point2<float> PVar1;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  size_t sVar3;
  ParsedParameter *pPVar4;
  size_t __n;
  ulong uVar5;
  int iVar6;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *pvVar7;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [64];
  allocator_type local_49;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *local_48;
  int local_40;
  int local_3c;
  char *local_38;
  undefined1 extraout_var [56];
  
  paVar2 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar3 = (this->params).nStored;
  paVar8 = &(this->params).field_2;
  if (paVar2 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar8 = paVar2;
  }
  local_48 = __return_storage_ptr__;
  if (sVar3 != 0) {
    lVar11 = 0;
    local_40 = nPerItem;
    local_38 = typeName;
    do {
      pPVar4 = *(ParsedParameter **)((long)paVar8 + lVar11);
      __n = (pPVar4->name)._M_string_length;
      if ((__n == name->_M_string_length) &&
         (((args = &pPVar4->name, __n == 0 ||
           (iVar6 = bcmp((args->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar6 == 0)) &&
          (iVar6 = std::__cxx11::string::compare((char *)pPVar4), iVar6 == 0)))) {
        pvVar7 = (*getValues)(pPVar4);
        local_3c = local_40;
        uVar5 = pvVar7->nStored;
        if (uVar5 == 0) {
          ErrorExit<std::__cxx11::string_const&>(&pPVar4->loc,"No values provided for \"%s\".",args)
          ;
        }
        uVar9 = (ulong)local_40;
        if (uVar5 % uVar9 == 0) {
          pPVar4->lookedUp = true;
          std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
                    (local_48,uVar5 / uVar9,&local_49);
          if (uVar5 < uVar9) {
            return local_48;
          }
          lVar11 = 0;
          uVar10 = 0;
          do {
            auVar12._0_8_ = (*convert)((double *)((long)pvVar7->ptr + lVar11),&pPVar4->loc);
            auVar12._8_56_ = extraout_var;
            lVar11 = lVar11 + uVar9 * 8;
            PVar1.super_Tuple2<pbrt::Point2,_float> =
                 (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar12._0_16_);
            (local_48->
            super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar10].super_Tuple2<pbrt::Point2,_float> =
                 PVar1.super_Tuple2<pbrt::Point2,_float>;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar5 / uVar9);
          return local_48;
        }
        ErrorExit<std::__cxx11::string_const&,int&>
                  (&pPVar4->loc,"Number of values provided for \"%s\" not a multiple of %d",args,
                   &local_3c);
      }
      lVar11 = lVar11 + 8;
    } while (sVar3 << 3 != lVar11);
  }
  (local_48->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (local_48->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_48->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_48;
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}